

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclPrintBuffersOne(SC_Man *p,Abc_Obj_t *pObj,int nOffset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  SC_Cell *pSVar6;
  uint uVar7;
  char *pcVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  
  uVar1 = 0;
  uVar7 = 0;
  if (0 < nOffset) {
    uVar1 = nOffset;
    uVar7 = nOffset;
  }
  while (uVar1 != 0) {
    printf("    ");
    uVar1 = uVar1 - 1;
  }
  uVar1 = pObj->Id;
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 2) {
    pcVar8 = "pi";
  }
  else {
    pcVar8 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  }
  uVar2 = (pObj->vFanouts).nSize;
  uVar3 = Abc_SclCountBufferFanouts(pObj);
  uVar4 = Abc_SclCountNonBufferFanouts(pObj);
  printf("%6d: %-16s (%2d:%3d:%3d)  ",(ulong)uVar1,pcVar8,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  for (; uVar7 < 4; uVar7 = uVar7 + 1) {
    printf("    ");
  }
  dVar12 = 0.0;
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 2) {
    pSVar6 = Abc_SclObjCell(pObj);
    dVar12 = (double)pSVar6->area;
  }
  printf("a =%5.2f  ",dVar12);
  printf("d = (");
  printf("%6.0f ps; ",(double)p->pTimes[(uint)pObj->Id].rise);
  printf("%6.0f ps)  ",(double)p->pTimes[(uint)pObj->Id].fall);
  fVar9 = p->pLoads[(uint)pObj->Id].rise;
  fVar10 = p->pLoads[(uint)pObj->Id].fall;
  if (fVar9 <= fVar10) {
    fVar9 = fVar10;
  }
  printf("l =%5.0f ff  ",(double)fVar9);
  fVar9 = p->pSlews[(uint)pObj->Id].rise;
  fVar10 = p->pSlews[(uint)pObj->Id].fall;
  if (fVar9 <= fVar10) {
    fVar9 = fVar10;
  }
  printf("s =%5.0f ps   ",(double)fVar9);
  fVar9 = Abc_SclObjGetSlack(p,pObj,p->MaxDelay0);
  printf("sl =%5.0f ps   ",(double)fVar9);
  if (nOffset == 0) {
    fVar9 = Abc_SclCountNonBufferLoad(p,pObj);
    printf("L =%5.0f ff   ",(double)fVar9);
    fVar9 = Abc_SclCountNonBufferLoad(p,pObj);
    printf("Lx =%5.0f ff  ",((double)fVar9 * 100.0) / (double)p->EstLoadAve);
    fVar9 = Abc_SclCountNonBufferDelay(p,pObj);
    iVar5 = Abc_SclCountNonBufferFanouts(pObj);
    printf("Dx =%5.0f ps  ",(double)(fVar9 / (float)iVar5) - (double)p->pTimes[(uint)pObj->Id].rise)
    ;
    fVar10 = Abc_SclCountNonBufferDelay(p,pObj);
    iVar5 = Abc_SclCountNonBufferFanouts(pObj);
    fVar9 = p->pTimes[(uint)pObj->Id].rise;
    fVar11 = Abc_SclCountNonBufferLoad(p,pObj);
    dVar12 = log((double)(fVar11 / p->EstLoadAve));
    printf("Cx =%5.0f ps",((double)(fVar10 / (float)iVar5) - (double)fVar9) / dVar12);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_SclPrintBuffersOne( SC_Man * p, Abc_Obj_t * pObj, int nOffset )
{
    int i;
    for ( i = 0; i < nOffset; i++ )
        printf( "    " );
    printf( "%6d: %-16s (%2d:%3d:%3d)  ", 
        Abc_ObjId(pObj), 
        Abc_ObjIsPi(pObj) ? "pi" : Mio_GateReadName((Mio_Gate_t *)pObj->pData), 
        Abc_ObjFanoutNum(pObj), 
        Abc_SclCountBufferFanouts(pObj), 
        Abc_SclCountNonBufferFanouts(pObj) );
    for ( ; i < 4; i++ )
        printf( "    " );
    printf( "a =%5.2f  ",      Abc_ObjIsPi(pObj) ? 0 : Abc_SclObjCell(pObj)->area );
    printf( "d = (" );
    printf( "%6.0f ps; ",      Abc_SclObjTimeOne(p, pObj, 1) );
    printf( "%6.0f ps)  ",     Abc_SclObjTimeOne(p, pObj, 0) );
    printf( "l =%5.0f ff  ",   Abc_SclObjLoadMax(p, pObj) );
    printf( "s =%5.0f ps   ",  Abc_SclObjSlewMax(p, pObj) );
    printf( "sl =%5.0f ps   ", Abc_SclObjSlackMax(p, pObj, p->MaxDelay0) );
    if ( nOffset == 0 )
    {
    printf( "L =%5.0f ff   ",  Abc_SclCountNonBufferLoad(p, pObj) );
    printf( "Lx =%5.0f ff  ",  100.0*Abc_SclCountNonBufferLoad(p, pObj)/p->EstLoadAve );
    printf( "Dx =%5.0f ps  ",  Abc_SclCountNonBufferDelay(p, pObj)/Abc_SclCountNonBufferFanouts(pObj) - Abc_SclObjTimeOne(p, pObj, 1) );
    printf( "Cx =%5.0f ps",    (Abc_SclCountNonBufferDelay(p, pObj)/Abc_SclCountNonBufferFanouts(pObj) - Abc_SclObjTimeOne(p, pObj, 1))/log(Abc_SclCountNonBufferLoad(p, pObj)/p->EstLoadAve) );
    }
    printf( "\n" );
}